

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

PyObject * pybind11::cpp_function::dispatcher(PyObject *self,PyObject *args,PyObject *kwargs)

{
  PyTypeObject *pPVar1;
  undefined8 *puVar2;
  uint uVar3;
  PyObject *pPVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  long *plVar8;
  long lVar9;
  type_info *ptVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  key_type *pkVar13;
  object *poVar14;
  key_type **ppkVar15;
  PyObject *pPVar16;
  key_type **ppkVar17;
  size_type *psVar18;
  ulong uVar19;
  int iVar20;
  char cVar21;
  uint __len;
  ulong uVar22;
  long lVar23;
  key_type *pkVar24;
  string sig;
  uint __uval;
  tuple args_;
  tuple args__1;
  string local_110;
  PyObject *local_f0;
  handle local_e8;
  long local_e0;
  PyObject local_d8;
  undefined8 *local_c8;
  accessor<pybind11::detail::accessor_policies::tuple_item> local_c0;
  handle local_a0 [2];
  PyObject local_90;
  long local_80;
  long local_78;
  PyObject *local_68;
  handle local_60;
  handle local_58;
  long local_50;
  PyObject local_48;
  PyTypeObject *local_38;
  
  local_c8 = (undefined8 *)PyCapsule_GetPointer(self,0);
  if ((args->ob_type->tp_flags & 0x4000000) == 0) {
    __assert_fail("PyTuple_Check(args)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/okdshin[P]Yender/pybind11/include/pybind11/pybind11.h"
                  ,0x174,
                  "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                 );
  }
  uVar22 = args[1].ob_refcnt;
  if (kwargs == (PyObject *)0x0) {
    lVar6 = 0;
  }
  else {
    lVar6 = PyDict_Size(kwargs);
  }
  lVar23 = lVar6;
  pPVar16 = local_f0;
  puVar11 = local_c8;
  puVar12 = local_c8;
  lVar9 = local_80;
  pPVar4 = local_68;
  if (uVar22 == 0) {
    local_38 = (PyTypeObject *)0x0;
    local_68 = args;
    local_f0 = kwargs;
  }
  else {
    if ((args->ob_type->tp_flags & 0x4000000) == 0) {
      __assert_fail("PyTuple_Check(args)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/okdshin[P]Yender/pybind11/include/pybind11/pybind11.h"
                    ,0x177,
                    "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                   );
    }
    local_38 = args[1].ob_type;
    local_68 = args;
    local_f0 = kwargs;
  }
  for (; local_80 = lVar23, local_c8 = puVar12, puVar11 != (undefined8 *)0x0;
      puVar11 = (undefined8 *)puVar11[0x10]) {
    args->ob_refcnt = args->ob_refcnt + 1;
    uVar19 = ((long)(puVar11[4] - puVar11[3]) >> 3) * -0x5555555555555555;
    local_e8.m_ptr = args;
    if (uVar22 < uVar19) {
      tuple::tuple((tuple *)&local_110,uVar19);
      object::operator=((object *)&local_e8,(object *)&local_110);
      object::~object((object *)&local_110);
      if (uVar22 != 0) {
        uVar7 = 0;
        do {
          if ((args->ob_type->tp_flags & 0x4000000) == 0) {
            __assert_fail("PyTuple_Check(args)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/okdshin[P]Yender/pybind11/include/pybind11/pybind11.h"
                          ,0x18a,
                          "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                         );
          }
          pPVar1 = (&args[1].ob_type)[uVar7];
          if (pPVar1 != (PyTypeObject *)0x0) {
            (pPVar1->ob_base).ob_base.ob_refcnt = (pPVar1->ob_base).ob_base.ob_refcnt + 1;
          }
          if (((local_e8.m_ptr)->ob_type->tp_flags & 0x4000000) == 0) {
            __assert_fail("PyTuple_Check(args_.ptr())",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/okdshin[P]Yender/pybind11/include/pybind11/pybind11.h"
                          ,0x18b,
                          "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                         );
          }
          (&local_e8.m_ptr[1].ob_type)[uVar7] = pPVar1;
          uVar7 = uVar7 + 1;
        } while (uVar22 != uVar7);
      }
      puVar12 = (undefined8 *)puVar11[3];
      puVar2 = (undefined8 *)puVar11[4];
      if (puVar12 == puVar2) {
        lVar9 = 0;
        args = local_68;
        lVar6 = local_80;
      }
      else {
        lVar23 = 0x18;
        local_78 = 0;
        do {
          if (((local_e8.m_ptr)->ob_type->tp_flags & 0x4000000) == 0) {
            __assert_fail("PyTuple_Check(args_.ptr())",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/okdshin[P]Yender/pybind11/include/pybind11/pybind11.h"
                          ,0x191,
                          "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                         );
          }
          if (*(long *)((long)&(local_e8.m_ptr)->ob_refcnt + lVar23) == 0) {
            if ((local_f0 == (PyObject *)0x0) ||
               (plVar8 = (long *)PyDict_GetItemString(local_f0,*puVar12), plVar8 == (long *)0x0)) {
              plVar8 = (long *)puVar12[2];
              if (plVar8 == (long *)0x0) {
                lVar9 = -1;
                args = local_68;
                lVar6 = local_80;
                kwargs = local_f0;
                break;
              }
            }
            else {
              local_78 = local_78 + 1;
            }
            *plVar8 = *plVar8 + 1;
            if (((local_e8.m_ptr)->ob_type->tp_flags & 0x4000000) == 0) {
              __assert_fail("PyTuple_Check(args_.ptr())",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/okdshin[P]Yender/pybind11/include/pybind11/pybind11.h"
                            ,0x19e,
                            "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                           );
            }
            *(long **)((long)&(local_e8.m_ptr)->ob_refcnt + lVar23) = plVar8;
          }
          puVar12 = puVar12 + 3;
          lVar23 = lVar23 + 8;
          lVar9 = local_78;
          args = local_68;
          lVar6 = local_80;
          kwargs = local_f0;
        } while (puVar12 != puVar2);
      }
    }
    else {
      lVar9 = 0;
      uVar19 = uVar22;
    }
    if (((lVar9 == lVar6) || ((*(byte *)((long)puVar11 + 0x59) & 0x10) != 0)) &&
       ((uVar19 == *(ushort *)((long)puVar11 + 0x5a) || ((*(byte *)((long)puVar11 + 0x59) & 8) != 0)
        ))) {
      pPVar16 = (PyObject *)(*(code *)puVar11[6])(puVar11,local_e8.m_ptr,kwargs,local_38);
      object::~object((object *)&local_e8);
      if (pPVar16 != (PyObject *)0x1) {
        if (pPVar16 != (PyObject *)0x0) {
          if ((*(byte *)((long)local_c8 + 0x59) & 1) == 0) {
            return pPVar16;
          }
          if ((args->ob_type->tp_flags & 0x4000000) == 0) {
            __assert_fail("PyTuple_Check(args)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/okdshin[P]Yender/pybind11/include/pybind11/pybind11.h"
                          ,0x205,
                          "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                         );
          }
          pPVar1 = args[1].ob_type;
          ptVar10 = detail::get_type_info((pPVar1->ob_base).ob_base.ob_type);
          (*ptVar10->init_holder)((PyObject *)pPVar1,(void *)0x0);
          return pPVar16;
        }
        local_e8.m_ptr = &local_d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e8,
                   "Unable to convert function return value to a Python type! The signature was\n\t"
                   ,"");
        std::__cxx11::string::append((char *)&local_e8);
        PyErr_SetString(_PyExc_TypeError,local_e8.m_ptr);
        if (local_e8.m_ptr == &local_d8) {
          return (PyObject *)0x0;
        }
        goto LAB_00113435;
      }
    }
    else {
      object::~object((object *)&local_e8);
    }
    lVar23 = local_80;
    pPVar16 = local_f0;
    puVar12 = local_c8;
    lVar9 = local_80;
    pPVar4 = local_68;
  }
  if ((*(byte *)((long)puVar12 + 0x59) & 4) != 0) {
    __Py_NotImplementedStruct = __Py_NotImplementedStruct + 1;
    return (PyObject *)&_Py_NotImplementedStruct;
  }
  local_f0 = pPVar16;
  local_80 = lVar9;
  local_68 = pPVar4;
  std::__cxx11::string::string((string *)local_a0,(char *)*puVar12,(allocator *)&local_60);
  plVar8 = (long *)std::__cxx11::string::append((char *)local_a0);
  ppkVar17 = (key_type **)&local_c0.key;
  ppkVar15 = (key_type **)(plVar8 + 2);
  if ((key_type **)*plVar8 == ppkVar15) {
    local_c0.key = (key_type)*ppkVar15;
    local_c0.cache.super_handle.m_ptr = (handle)plVar8[3];
    local_c0._0_8_ = ppkVar17;
  }
  else {
    local_c0.key = (key_type)*ppkVar15;
    local_c0._0_8_ = (key_type **)*plVar8;
  }
  local_c0.obj.m_ptr = (PyObject *)plVar8[1];
  *plVar8 = (long)ppkVar15;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  iVar20 = 0x121285;
  if ((*(byte *)((long)puVar12 + 0x59) & 1) != 0) {
    iVar20 = 0x121279;
  }
  local_58.m_ptr = &local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,iVar20,iVar20 + (*(byte *)((long)puVar12 + 0x59) & 1) * 3 + 8);
  pkVar24 = (key_type *)((long)&(local_c0.obj.m_ptr)->ob_refcnt + local_50);
  pkVar13 = (key_type *)0xf;
  if ((key_type **)local_c0._0_8_ != ppkVar17) {
    pkVar13 = (key_type *)local_c0.key;
  }
  if (pkVar13 < pkVar24) {
    pkVar13 = (key_type *)0xf;
    if (local_58.m_ptr != &local_48) {
      pkVar13 = (key_type *)local_48.ob_refcnt;
    }
    if (pkVar24 <= pkVar13) {
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,local_c0._0_8_);
      goto LAB_00112eb8;
    }
  }
  puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_58.m_ptr);
LAB_00112eb8:
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  psVar18 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar18) {
    local_110.field_2._M_allocated_capacity = *psVar18;
    local_110.field_2._8_8_ = puVar11[3];
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar18;
    local_110._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_110._M_string_length = puVar11[1];
  *puVar11 = psVar18;
  puVar11[1] = 0;
  *(undefined1 *)psVar18 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_110);
  local_e8.m_ptr = &local_d8;
  pPVar16 = (PyObject *)(plVar8 + 2);
  if ((PyObject *)*plVar8 == pPVar16) {
    local_d8.ob_refcnt = pPVar16->ob_refcnt;
    local_d8.ob_type = (PyTypeObject *)plVar8[3];
  }
  else {
    local_d8.ob_refcnt = pPVar16->ob_refcnt;
    local_e8.m_ptr = (PyObject *)*plVar8;
  }
  local_e0 = plVar8[1];
  *plVar8 = (long)pPVar16;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (local_58.m_ptr != &local_48) {
    operator_delete(local_58.m_ptr,local_48.ob_refcnt + 1);
  }
  if ((key_type **)local_c0._0_8_ != ppkVar17) {
    operator_delete((void *)local_c0._0_8_,local_c0.key + 1);
  }
  if (local_a0[0].m_ptr != &local_90) {
    operator_delete(local_a0[0].m_ptr,local_90.ob_refcnt + 1);
  }
  local_f0 = (PyObject *)0x0;
  puVar11 = local_c8;
  do {
    uVar3 = (uint)local_f0;
    local_f0 = (PyObject *)(ulong)(uVar3 + 1);
    __len = 1;
    if (8 < uVar3) {
      pPVar16 = local_f0;
      uVar3 = 4;
      do {
        __len = uVar3;
        uVar5 = (uint)pPVar16;
        if (uVar5 < 100) {
          __len = __len - 2;
          goto LAB_00113039;
        }
        if (uVar5 < 1000) {
          __len = __len - 1;
          goto LAB_00113039;
        }
        if (uVar5 < 10000) goto LAB_00113039;
        pPVar16 = (PyObject *)((ulong)pPVar16 / 10000);
        uVar3 = __len + 4;
      } while (99999 < uVar5);
      __len = __len + 1;
    }
LAB_00113039:
    local_a0[0].m_ptr = &local_90;
    std::__cxx11::string::_M_construct((ulong)local_a0,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_a0[0].m_ptr,__len,(uint)local_f0);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)local_a0,0,(char *)0x0,0x1212c7);
    ppkVar17 = (key_type **)(plVar8 + 2);
    if ((key_type **)*plVar8 == ppkVar17) {
      local_c0.key = (key_type)*ppkVar17;
      local_c0.cache.super_handle.m_ptr = (handle)plVar8[3];
      local_c0._0_8_ = &local_c0.key;
    }
    else {
      local_c0.key = (key_type)*ppkVar17;
      local_c0._0_8_ = (key_type **)*plVar8;
    }
    local_c0.obj.m_ptr = (PyObject *)plVar8[1];
    *plVar8 = (long)ppkVar17;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_c0);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    psVar18 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_110.field_2._M_allocated_capacity = *psVar18;
      local_110.field_2._8_8_ = puVar12[3];
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar18;
      local_110._M_dataplus._M_p = (pointer)*puVar12;
    }
    local_110._M_string_length = puVar12[1];
    *puVar12 = psVar18;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_110._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((key_type *)local_c0._0_8_ != &local_c0.key) {
      operator_delete((void *)local_c0._0_8_,local_c0.key + 1);
    }
    if (local_a0[0].m_ptr != &local_90) {
      operator_delete(local_a0[0].m_ptr,local_90.ob_refcnt + 1);
    }
    if ((*(byte *)((long)local_c8 + 0x59) & 1) == 0) {
LAB_001132c6:
      std::__cxx11::string::append((char *)&local_e8);
    }
    else {
      std::__cxx11::string::string((string *)&local_110,(char *)puVar11[2],(allocator *)&local_c0);
      cVar21 = (char)&local_110;
      lVar6 = std::__cxx11::string::find(cVar21,0x28);
      uVar22 = lVar6 + 7;
      if (local_110._M_string_length <= uVar22) {
LAB_001132a5:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        goto LAB_001132c6;
      }
      uVar19 = std::__cxx11::string::find((char *)&local_110,0x1212cc,0);
      local_78 = std::__cxx11::string::rfind((char *)&local_110,0x1212cf,0xffffffffffffffff);
      if (uVar19 < local_110._M_string_length) {
        uVar7 = uVar19 + 2;
      }
      else {
        uVar7 = std::__cxx11::string::find(cVar21,0x29);
        uVar19 = uVar7;
      }
      if ((uVar19 <= uVar22) || (local_110._M_string_length <= uVar7)) goto LAB_001132a5;
      std::__cxx11::string::append((string *)&local_e8,(ulong)&local_110,uVar22);
      std::__cxx11::string::push_back((char)(string *)&local_e8);
      std::__cxx11::string::append((string *)&local_e8,(ulong)&local_110,uVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::string::append((char *)&local_e8);
    puVar11 = (undefined8 *)puVar11[0x10];
    if (puVar11 == (undefined8 *)0x0) {
      std::__cxx11::string::append((char *)&local_e8);
      if (args != (PyObject *)0x0) {
        args->ob_refcnt = args->ob_refcnt + 1;
      }
      pkVar24 = (key_type *)(ulong)(*(byte *)((long)local_c8 + 0x59) & 1);
      local_a0[0].m_ptr = args;
      while (pkVar13 = (key_type *)PyTuple_Size(local_a0[0].m_ptr), pkVar24 < pkVar13) {
        local_c0.obj.m_ptr = local_a0[0].m_ptr;
        local_c0.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
        local_c0.key = (key_type)pkVar24;
        poVar14 = detail::accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
                            (&local_c0);
        local_60.m_ptr = (poVar14->super_handle).m_ptr;
        if (local_60.m_ptr != (PyObject *)0x0) {
          (local_60.m_ptr)->ob_refcnt = (local_60.m_ptr)->ob_refcnt + 1;
        }
        local_58.m_ptr = (PyObject *)PyObject_Str();
        str::operator_cast_to_string(&local_110,(str *)&local_58);
        std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_110._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        object::~object((object *)&local_58);
        object::~object((object *)&local_60);
        object::~object(&local_c0.cache);
        pkVar13 = (key_type *)PyTuple_Size(local_a0[0].m_ptr);
        pkVar24 = (key_type *)((long)pkVar24 + 1);
        if (pkVar24 != pkVar13) {
          std::__cxx11::string::append((char *)&local_e8);
        }
      }
      PyErr_SetString(_PyExc_TypeError,local_e8.m_ptr);
      object::~object((object *)local_a0);
      if (local_e8.m_ptr != &local_d8) {
LAB_00113435:
        operator_delete(local_e8.m_ptr,local_d8.ob_refcnt + 1);
      }
      return (PyObject *)0x0;
    }
  } while( true );
}

Assistant:

static PyObject *dispatcher(PyObject *self, PyObject *args, PyObject *kwargs) {
        /* Iterator over the list of potentially admissible overloads */
        detail::function_record *overloads = (detail::function_record *) PyCapsule_GetPointer(self, nullptr),
                                *it = overloads;

        /* Need to know how many arguments + keyword arguments there are to pick the right overload */
        size_t nargs = (size_t) PyTuple_GET_SIZE(args),
               nkwargs = kwargs ? (size_t) PyDict_Size(kwargs) : 0;

        handle parent = nargs > 0 ? PyTuple_GET_ITEM(args, 0) : nullptr,
               result = PYBIND11_TRY_NEXT_OVERLOAD;
        try {
            for (; it != nullptr; it = it->next) {
                tuple args_(args, true);
                size_t kwargs_consumed = 0;

                /* For each overload:
                   1. If the required list of arguments is longer than the
                      actually provided amount, create a copy of the argument
                      list and fill in any available keyword/default arguments.
                   2. Ensure that all keyword arguments were "consumed"
                   3. Call the function call dispatcher (function_record::impl)
                 */
                size_t nargs_ = nargs;
                if (nargs < it->args.size()) {
                    nargs_ = it->args.size();
                    args_ = tuple(nargs_);
                    for (size_t i = 0; i < nargs; ++i) {
                        handle item = PyTuple_GET_ITEM(args, i);
                        PyTuple_SET_ITEM(args_.ptr(), i, item.inc_ref().ptr());
                    }

                    int arg_ctr = 0;
                    for (auto const &it2 : it->args) {
                        int index = arg_ctr++;
                        if (PyTuple_GET_ITEM(args_.ptr(), index))
                            continue;

                        handle value;
                        if (kwargs)
                            value = PyDict_GetItemString(kwargs, it2.name);

                        if (value)
                            kwargs_consumed++;
                        else if (it2.value)
                            value = it2.value;

                        if (value) {
                            PyTuple_SET_ITEM(args_.ptr(), index, value.inc_ref().ptr());
                        } else {
                            kwargs_consumed = (size_t) -1; /* definite failure */
                            break;
                        }
                    }
                }

                try {
                    if ((kwargs_consumed == nkwargs || it->has_kwargs) &&
                        (nargs_ == it->nargs || it->has_args))
                        result = it->impl(it, args_, kwargs, parent);
                } catch (reference_cast_error &) {
                    result = PYBIND11_TRY_NEXT_OVERLOAD;
                }

                if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                    break;
            }
        } catch (error_already_set &e) {
            e.restore();
            return nullptr;
        } catch (...) {
            /* When an exception is caught, give each registered exception
               translator a chance to translate it to a Python exception
               in reverse order of registration.

               A translator may choose to do one of the following:

                - catch the exception and call PyErr_SetString or PyErr_SetObject
                  to set a standard (or custom) Python exception, or
                - do nothing and let the exception fall through to the next translator, or
                - delegate translation to the next translator by throwing a new type of exception. */

            auto last_exception = std::current_exception();
            auto &registered_exception_translators = pybind11::detail::get_internals().registered_exception_translators;
            for (auto& translator : registered_exception_translators) {
                try {
                    translator(last_exception);
                } catch (...) {
                    last_exception = std::current_exception();
                    continue;
                }
                return nullptr;
            }
            PyErr_SetString(PyExc_SystemError, "Exception escaped from default exception translator!");
            return nullptr;
        }

        if (result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
            if (overloads->is_operator)
                return handle(Py_NotImplemented).inc_ref().ptr();

            std::string msg = std::string(overloads->name) + "(): incompatible " +
                std::string(overloads->is_constructor ? "constructor" : "function") +
                " arguments. The following argument types are supported:\n";

            int ctr = 0;
            for (detail::function_record *it2 = overloads; it2 != nullptr; it2 = it2->next) {
                msg += "    "+ std::to_string(++ctr) + ". ";

                bool wrote_sig = false;
                if (overloads->is_constructor) {
                    // For a constructor, rewrite `(self: Object, arg0, ...) -> NoneType` as `Object(arg0, ...)`
                    std::string sig = it2->signature;
                    size_t start = sig.find('(') + 7; // skip "(self: "
                    if (start < sig.size()) {
                        // End at the , for the next argument
                        size_t end = sig.find(", "), next = end + 2;
                        size_t ret = sig.rfind(" -> ");
                        // Or the ), if there is no comma:
                        if (end >= sig.size()) next = end = sig.find(')');
                        if (start < end && next < sig.size()) {
                            msg.append(sig, start, end - start);
                            msg += '(';
                            msg.append(sig, next, ret - next);
                            wrote_sig = true;
                        }
                    }
                }
                if (!wrote_sig) msg += it2->signature;

                msg += "\n";
            }
            msg += "\nInvoked with: ";
            tuple args_(args, true);
            for (size_t ti = overloads->is_constructor ? 1 : 0; ti < args_.size(); ++ti) {
                msg += static_cast<std::string>(static_cast<object>(args_[ti]).str());
                if ((ti + 1) != args_.size() )
                    msg += ", ";
            }
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else if (!result) {
            std::string msg = "Unable to convert function return value to a "
                              "Python type! The signature was\n\t";
            msg += it->signature;
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else {
            if (overloads->is_constructor) {
                /* When a constructor ran successfully, the corresponding
                   holder type (e.g. std::unique_ptr) must still be initialized. */
                PyObject *inst = PyTuple_GET_ITEM(args, 0);
                auto tinfo = detail::get_type_info(Py_TYPE(inst));
                tinfo->init_holder(inst, nullptr);
            }
            return result.ptr();
        }
    }